

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# v_hashmap.h
# Opt level: O0

bool __thiscall
v_hashmap<substring,_unsigned_long>::is_equivalent
          (v_hashmap<substring,_unsigned_long> *this,substring *key,substring *key2)

{
  byte bVar1;
  undefined8 in_RDX;
  undefined8 in_RSI;
  long *in_RDI;
  bool local_1;
  
  if ((*in_RDI == 0) && (in_RDI[1] == 0)) {
    local_1 = true;
  }
  else if (*in_RDI == 0) {
    bVar1 = (*(code *)in_RDI[1])(in_RSI,in_RDX);
    local_1 = (bool)(bVar1 & 1);
  }
  else {
    bVar1 = (*(code *)*in_RDI)(in_RDI[9],in_RSI,in_RDX);
    local_1 = (bool)(bVar1 & 1);
  }
  return local_1;
}

Assistant:

bool is_equivalent(const K& key, const K& key2)
  {
    if ((equivalent == nullptr) && (equivalent_no_data == nullptr))
      return true;
    else if (equivalent != nullptr)
      return equivalent(eq_data, key, key2);
    else
      return equivalent_no_data(key, key2);
  }